

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_numeric_suite.cpp
# Opt level: O2

void inner_product_suite::test_overfull(void)

{
  int iVar1;
  initializer_list<int> input;
  initializer_list<int> input_00;
  iterator iVar2;
  iterator iVar3;
  undefined4 local_8c;
  int local_88 [8];
  array<int,_4UL> array;
  circular_view<int,_18446744073709551615UL> span;
  
  array._M_elems[0] = 0;
  array._M_elems[1] = 0;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_88[0] = 0xb;
  local_88[1] = 0x16;
  local_88[2] = 0x21;
  local_88[3] = 0x2c;
  input._M_len = 4;
  input._M_array = local_88;
  span.member.data = array._M_elems;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar1 = std::
          inner_product<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*,int>
                    (iVar2,iVar3,array._M_elems,0);
  local_88[0] = iVar1;
  local_8c = 0xe2e;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "11 * 11 + 22 * 22 + 33 * 33 + 44 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x34,"void inner_product_suite::test_overfull()",local_88,&local_8c);
  local_88[0] = 0xb;
  local_88[1] = 0x16;
  local_88[2] = 0x21;
  local_88[3] = 0x2c;
  local_88[4] = 0x37;
  input_00._M_len = 5;
  input_00._M_array = local_88;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input_00);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar3 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  iVar1 = std::
          inner_product<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*,int>
                    (iVar2,iVar3,array._M_elems,0);
  local_88[0] = iVar1;
  local_8c = 0x16b0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("std::inner_product(span.begin(), span.end(), array.begin(), 0)",
             "22 * 55 + 33 * 22 + 44 * 33 + 55 * 44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_numeric_suite.cpp"
             ,0x37,"void inner_product_suite::test_overfull()",local_88,&local_8c);
  return;
}

Assistant:

void test_overfull()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span = { 11, 22, 33, 44 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  11 * 11 + 22 * 22 + 33 * 33 + 44 * 44);
    span = { 11, 22, 33, 44, 55 };
    BOOST_TEST_EQ(std::inner_product(span.begin(), span.end(), array.begin(), 0),
                  22 * 55 + 33 * 22 + 44 * 33 + 55 * 44);
}